

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

LValue * __thiscall
slang::ast::ElementSelectExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,ElementSelectExpression *this,EvalContext *context)

{
  Type *this_00;
  bool bVar1;
  Type *pTVar2;
  optional<slang::ConstantRange> oVar3;
  bool softFail;
  ConstantValue associativeIndex;
  ConstantValue loadedVal;
  LValue lval;
  bool local_221;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_220;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_1f8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_1d0;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1a8;
  
  Expression::evalLValue((LValue *)&local_1a8,this->value_,context);
  if (local_1a8._M_index == '\0') {
    (__return_storage_ptr__->value).
    super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
    ._M_index = '\0';
    goto LAB_0042772c;
  }
  local_1d0._M_index = '\0';
  bVar1 = Type::hasFixedRange((this->value_->type).ptr);
  if (!bVar1) {
    LValue::load((ConstantValue *)&local_1f8,(LValue *)&local_1a8);
    local_220._0_8_ = &local_1d0;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
      ::_S_vtable._M_arr[(long)(char)local_1f8._M_index + 1]._M_data)
              ((anon_class_8_1_8991fb9c *)&local_220,
               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)&local_1f8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_1f8);
  }
  local_221 = false;
  local_1f8._M_index = '\0';
  oVar3 = evalIndex(this,context,(ConstantValue *)&local_1d0,(ConstantValue *)&local_1f8,&local_221)
  ;
  if ((((undefined1  [12])
        oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
       (undefined1  [12])0x0) && (local_1f8._M_index == '\0')) {
    if (local_221 != false) {
      Type::getDefaultValue((ConstantValue *)&local_220,(this->super_Expression).type.ptr);
      LValue::addIndexOutOfBounds((LValue *)&local_1a8,(ConstantValue *)&local_220);
      goto LAB_004276fe;
    }
    (__return_storage_ptr__->value).
    super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
    ._M_index = '\0';
  }
  else {
    this_00 = (this->value_->type).ptr;
    bVar1 = Type::hasFixedRange(this_00);
    if (bVar1) {
      bVar1 = Type::isUnpackedArray(this_00);
      if (bVar1) {
        Type::getDefaultValue((ConstantValue *)&local_220,(this->super_Expression).type.ptr);
        LValue::addIndex((LValue *)&local_1a8,
                         oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_,
                         (ConstantValue *)&local_220);
        goto LAB_004276fe;
      }
      LValue::addBitSlice((LValue *)&local_1a8,
                          oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value);
    }
    else {
      pTVar2 = this_00->canonical;
      if (pTVar2 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar2 = this_00->canonical;
      }
      if ((pTVar2->super_Symbol).kind == AssociativeArrayType) {
        Type::getDefaultValue((ConstantValue *)&local_220,(this->super_Expression).type.ptr);
        LValue::addArrayLookup
                  ((LValue *)&local_1a8,(ConstantValue *)&local_1f8,(ConstantValue *)&local_220);
      }
      else {
        Type::getDefaultValue((ConstantValue *)&local_220,(this->super_Expression).type.ptr);
        LValue::addIndex((LValue *)&local_1a8,
                         oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_,
                         (ConstantValue *)&local_220);
      }
LAB_004276fe:
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_220);
    }
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
    _Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     *)&local_1a8);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_1d0);
LAB_0042772c:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

LValue ElementSelectExpression::evalLValueImpl(EvalContext& context) const {
    LValue lval = value().evalLValue(context);
    if (!lval)
        return nullptr;

    ConstantValue loadedVal;
    if (!value().type->hasFixedRange())
        loadedVal = lval.load();

    bool softFail = false;
    ConstantValue associativeIndex;
    auto range = evalIndex(context, loadedVal, associativeIndex, softFail);
    if (!range && associativeIndex.bad()) {
        if (!softFail)
            return nullptr;

        // Add an out of bounds entry so that reads will return the default
        // and writes will be ignored.
        lval.addIndexOutOfBounds(type->getDefaultValue());
        return lval;
    }

    // Handling for packed and unpacked arrays, all integer types.
    const Type& valType = *value().type;
    if (valType.hasFixedRange()) {
        // For fixed types, we know we will always be in range, so just do the selection.
        if (valType.isUnpackedArray())
            lval.addIndex(range->left, type->getDefaultValue());
        else
            lval.addBitSlice(*range);
        return lval;
    }

    // Handling for associative arrays.
    if (valType.isAssociativeArray()) {
        lval.addArrayLookup(std::move(associativeIndex), type->getDefaultValue());
        return lval;
    }

    // Handling for strings, dynamic arrays, and queues.
    SLANG_ASSERT(range->left == range->right);
    lval.addIndex(range->left, type->getDefaultValue());

    return lval;
}